

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O0

Content * __thiscall Jupiter::HTTP::Server::Directory::find(Directory *this,string_view in_name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  const_reference pvVar6;
  size_type __len;
  reference this_00;
  pointer pCVar7;
  const_pointer __str;
  size_type sVar8;
  reference this_01;
  pointer pDVar9;
  undefined4 extraout_var;
  bool bVar10;
  __sv_type __y;
  unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
  *directory;
  iterator __end1;
  iterator __begin1;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
  *__range1;
  undefined1 auStack_98 [4];
  uint dir_name_checksum;
  string_view dir_name;
  unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
  *content_item;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
  *__range2;
  uint content_name_checksum;
  size_t index;
  string_view in_name_ref;
  Directory *this_local;
  string_view in_name_local;
  
  in_name_ref._M_len = (size_t)in_name._M_str;
  index = in_name._M_len;
  in_name_ref._M_str = (char *)this;
  this_local = (Directory *)index;
  in_name_local._M_len = in_name_ref._M_len;
  while( true ) {
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&index);
    bVar10 = false;
    if (!bVar3) {
      pvVar6 = std::basic_string_view<char,_std::char_traits<char>_>::front
                         ((basic_string_view<char,_std::char_traits<char>_> *)&index);
      bVar10 = *pvVar6 == '/';
    }
    if (!bVar10) break;
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&this_local,1);
  }
  __len = std::basic_string_view<char,_std::char_traits<char>_>::find
                    ((basic_string_view<char,_std::char_traits<char>_> *)&index,'/',0);
  if (__len == 0xffffffffffffffff) {
    uVar4 = calc_checksum<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)&index);
    std::
    vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
    ::size(&this->content);
    __end2 = std::
             vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
             ::begin(&this->content);
    content_item = (unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                    *)std::
                      vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                      ::end(&this->content);
    while (bVar10 = __gnu_cxx::
                    operator==<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
                              (&__end2,(__normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
                                        *)&content_item), ((bVar10 ^ 0xffU) & 1) != 0) {
      this_00 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
                ::operator*(&__end2);
      pCVar7 = std::
               unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
               ::operator->(this_00);
      sVar2 = in_name_ref._M_len;
      sVar1 = index;
      if (pCVar7->name_checksum == uVar4) {
        pCVar7 = std::
                 unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                 ::operator->(this_00);
        join_0x00000010_0x00000000_ =
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pCVar7->name);
        __x_00._M_str = (char *)sVar2;
        __x_00._M_len = sVar1;
        bVar10 = std::operator==(__x_00,join_0x00000010_0x00000000_);
        if (bVar10) {
          pCVar7 = std::
                   unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                   ::get(this_00);
          return pCVar7;
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  else {
    __str = std::basic_string_view<char,_std::char_traits<char>_>::data
                      ((basic_string_view<char,_std::char_traits<char>_> *)&index);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_98,__str,__len);
    sVar8 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_98);
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&index,sVar8 + 1);
    uVar4 = calc_checksum<unsigned_int,std::basic_string_view<char,std::char_traits<char>>>
                      ((basic_string_view<char,_std::char_traits<char>_> *)auStack_98);
    __end1 = std::
             vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
             ::begin(&this->directories);
    directory = (unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                 *)std::
                   vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>
                   ::end(&this->directories);
    while (bVar10 = __gnu_cxx::
                    operator==<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>_>
                              (&__end1,(__normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>_>
                                        *)&directory), ((bVar10 ^ 0xffU) & 1) != 0) {
      this_01 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>_>
                ::operator*(&__end1);
      pDVar9 = std::
               unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
               ::operator->(this_01);
      sVar2 = dir_name._M_len;
      sVar1 = _auStack_98;
      if (pDVar9->name_checksum == uVar4) {
        pDVar9 = std::
                 unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                 ::operator->(this_01);
        __y = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&pDVar9->name);
        __x._M_str = (char *)sVar2;
        __x._M_len = sVar1;
        bVar10 = std::operator==(__x,__y);
        if (bVar10) {
          pDVar9 = std::
                   unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>
                   ::operator->(this_01);
          iVar5 = (*pDVar9->_vptr_Directory[3])(pDVar9,index,in_name_ref._M_len);
          return (Content *)CONCAT44(extraout_var,iVar5);
        }
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_*,_std::vector<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Directory,_std::default_delete<Jupiter::HTTP::Server::Directory>_>_>_>_>
      ::operator++(&__end1);
    }
  }
  return (Content *)0x0;
}

Assistant:

Jupiter::HTTP::Server::Content *Jupiter::HTTP::Server::Directory::find(std::string_view in_name) {
	std::string_view in_name_ref = in_name;
	while (!in_name_ref.empty() && in_name_ref.front() == '/') {
		in_name.remove_prefix(1);
	}

	size_t index = in_name_ref.find('/');
	if (index == std::string_view::npos) { // Search content
		unsigned int content_name_checksum = calc_checksum(in_name_ref);
		index = content.size();
		for (auto& content_item : content) {
			if (content_item->name_checksum == content_name_checksum && content_item->name == in_name_ref) {
				return content_item.get();
			}
		}
		return nullptr; // No such content
	}

	// Just use split_once?
	std::string_view dir_name(in_name_ref.data(), index);
	in_name_ref.remove_prefix(dir_name.size() + 1);
	unsigned int dir_name_checksum = calc_checksum(dir_name);

	for (auto& directory : directories) {
		if (directory->name_checksum == dir_name_checksum && directory->name == dir_name) {
			return directory->find(in_name_ref);
		}
	}

	return nullptr; // No such directory
}